

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transform.cc
# Opt level: O0

void __thiscall pass_bundle_to_struct_Test::TestBody(pass_bundle_to_struct_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [8];
  __node_base _Var3;
  __node_base _Var4;
  Generator *pGVar5;
  Port *pPVar6;
  element_type *peVar7;
  Generator *top;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_998;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938 [32];
  undefined1 local_918 [16];
  undefined1 local_908 [32];
  undefined1 local_8e8 [32];
  undefined1 local_8c8 [39];
  allocator<char> local_8a1;
  string local_8a0;
  allocator<char> local_879;
  string local_878 [32];
  undefined1 local_858 [16];
  undefined1 local_848 [39];
  allocator<char> local_821;
  string local_820;
  allocator<char> local_7f9;
  string local_7f8 [32];
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [39];
  allocator<char> local_7a1;
  string local_7a0;
  undefined8 local_780;
  Port *mod1_b;
  string local_770;
  undefined1 local_750 [8];
  Port *mod1_a;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  allocator<char> local_6e1;
  string local_6e0 [32];
  undefined1 local_6c0 [16];
  undefined1 local_6b0 [39];
  allocator<char> local_689;
  string local_688;
  allocator<char> local_661;
  string local_660 [32];
  undefined1 local_640 [16];
  undefined1 local_630 [39];
  allocator<char> local_609;
  string local_608;
  undefined8 local_5e8;
  Port *port3_b;
  string local_5d8;
  undefined1 local_5b8 [8];
  Port *port3_a;
  allocator<char> local_4f9;
  undefined1 local_4f8 [32];
  undefined1 local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0;
  allocator<char> local_489;
  string local_488;
  allocator<char> local_461;
  string local_460 [32];
  undefined1 local_440 [16];
  undefined1 local_430 [39];
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0 [32];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [39];
  allocator<char> local_389;
  string local_388;
  undefined8 local_368;
  Port *port2_b;
  string local_358;
  undefined1 local_338 [8];
  Port *port2_a;
  undefined1 local_328 [32];
  undefined1 local_308 [24];
  string local_2f0;
  undefined1 local_2d0 [8];
  Generator *mod3;
  string local_2c0;
  __node_base local_2a0;
  Generator *mod2;
  string local_290;
  __node_base local_270;
  Generator *mod1;
  string local_260;
  allocator<char> local_239;
  string local_238;
  allocator<char> local_201;
  string local_200;
  undefined1 local_1e0 [8];
  PortBundleDefinition def;
  Context c;
  pass_bundle_to_struct_Test *this_local;
  
  kratos::Context::Context
            ((Context *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"bundle",&local_201);
  kratos::PortBundleDefinition::PortBundleDefinition((PortBundleDefinition *)local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::allocator<char>::~allocator(&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"a",&local_239);
  kratos::PortBundleDefinition::add_definition
            ((PortBundleDefinition *)local_1e0,&local_238,1,1,false,In,Data);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"b",(allocator<char> *)((long)&mod1 + 7));
  kratos::PortBundleDefinition::add_definition
            ((PortBundleDefinition *)local_1e0,&local_260,1,1,false,In,Data);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod1 + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"module1",(allocator<char> *)((long)&mod2 + 7));
  pGVar5 = kratos::Context::generator
                     ((Context *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod2 + 7));
  local_270._M_nxt = (_Hash_node_base *)pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c0,"module2",(allocator<char> *)((long)&mod3 + 7));
  pGVar5 = kratos::Context::generator
                     ((Context *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod3 + 7));
  local_2a0._M_nxt = (_Hash_node_base *)pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"module3",(allocator<char> *)(local_308 + 0x17));
  pGVar5 = kratos::Context::generator
                     ((Context *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count,
                      &local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)(local_308 + 0x17));
  _Var3._M_nxt = local_2a0._M_nxt;
  local_2d0 = (undefined1  [8])pGVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,"p",(allocator<char> *)((long)&port2_a + 7));
  kratos::Generator::add_bundle_port_def
            ((Generator *)local_308,(string *)_Var3._M_nxt,(PortBundleDefinition *)local_328);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_308);
  std::__cxx11::string::~string((string *)local_328);
  std::allocator<char>::~allocator((allocator<char> *)((long)&port2_a + 7));
  _Var3._M_nxt = local_2a0._M_nxt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"a",(allocator<char> *)((long)&port2_b + 7));
  pPVar6 = kratos::Generator::port((Generator *)_Var3._M_nxt,Out,&local_358,1);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator((allocator<char> *)((long)&port2_b + 7));
  _Var3._M_nxt = local_2a0._M_nxt;
  local_338 = (undefined1  [8])pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"b",&local_389);
  pPVar6 = kratos::Generator::port((Generator *)_Var3._M_nxt,Out,&local_388,1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  _Var3._M_nxt = local_2a0._M_nxt;
  auVar2 = local_338;
  local_368 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"p",&local_3e1);
  kratos::Generator::get_bundle_ref((Generator *)local_3c0,(string *)_Var3._M_nxt);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"a",&local_409);
  kratos::PortBundleRef::get_port(peVar7,&local_408);
  kratos::Var::assign((Var *)local_3b0,(Var *)auVar2);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_3b0);
  kratos::Generator::add_stmt
            ((Generator *)_Var3._M_nxt,(shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_3b0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_3b0);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::allocator<char>::~allocator(&local_3e1);
  _Var3._M_nxt = local_2a0._M_nxt;
  uVar1 = local_368;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"p",&local_461);
  kratos::Generator::get_bundle_ref((Generator *)local_440,(string *)_Var3._M_nxt);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"b",&local_489);
  kratos::PortBundleRef::get_port(peVar7,&local_488);
  kratos::Var::assign((Var *)local_430,(Var *)uVar1);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_430 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_430);
  kratos::Generator::add_stmt
            ((Generator *)_Var3._M_nxt,(shared_ptr<kratos::Stmt> *)(local_430 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_430 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_430);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_440);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  _Var4._M_nxt = local_270._M_nxt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"mod2",&local_4b1);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this
            ((enable_shared_from_this<kratos::Generator> *)(local_4d8 + 0x10));
  kratos::Generator::add_child_generator
            ((Generator *)_Var4._M_nxt,&local_4b0,
             (shared_ptr<kratos::Generator> *)(local_4d8 + 0x10));
  std::shared_ptr<kratos::Generator>::~shared_ptr
            ((shared_ptr<kratos::Generator> *)(local_4d8 + 0x10));
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator(&local_4b1);
  auVar2 = local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_4f8,"p",&local_4f9);
  kratos::PortBundleDefinition::flip
            ((PortBundleDefinition *)&port3_a,(PortBundleDefinition *)local_1e0);
  kratos::Generator::add_bundle_port_def
            ((Generator *)local_4d8,(string *)auVar2,(PortBundleDefinition *)local_4f8);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_4d8);
  kratos::PortBundleDefinition::~PortBundleDefinition((PortBundleDefinition *)&port3_a);
  std::__cxx11::string::~string((string *)local_4f8);
  std::allocator<char>::~allocator(&local_4f9);
  auVar2 = local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"a",(allocator<char> *)((long)&port3_b + 7));
  pPVar6 = kratos::Generator::port((Generator *)auVar2,In,&local_5d8,1);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&port3_b + 7));
  auVar2 = local_2d0;
  local_5b8 = (undefined1  [8])pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_608,"b",&local_609);
  pPVar6 = kratos::Generator::port((Generator *)auVar2,In,&local_608,1);
  std::__cxx11::string::~string((string *)&local_608);
  std::allocator<char>::~allocator(&local_609);
  auVar2 = local_2d0;
  local_5e8 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_660,"p",&local_661);
  kratos::Generator::get_bundle_ref((Generator *)local_640,(string *)auVar2);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_688,"a",&local_689);
  pPVar6 = kratos::PortBundleRef::get_port(peVar7,&local_688);
  kratos::Var::assign((Var *)local_630,&pPVar6->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_630 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_630);
  kratos::Generator::add_stmt((Generator *)auVar2,(shared_ptr<kratos::Stmt> *)(local_630 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_630 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_630);
  std::__cxx11::string::~string((string *)&local_688);
  std::allocator<char>::~allocator(&local_689);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_640);
  std::__cxx11::string::~string(local_660);
  std::allocator<char>::~allocator(&local_661);
  auVar2 = local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"p",&local_6e1);
  kratos::Generator::get_bundle_ref((Generator *)local_6c0,(string *)auVar2);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_6c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"b",&local_709);
  pPVar6 = kratos::PortBundleRef::get_port(peVar7,&local_708);
  kratos::Var::assign((Var *)local_6b0,&pPVar6->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_6b0 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_6b0);
  kratos::Generator::add_stmt((Generator *)auVar2,(shared_ptr<kratos::Stmt> *)(local_6b0 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_6b0 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_6b0);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_6c0);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  _Var4._M_nxt = local_270._M_nxt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"mod3",&local_731);
  std::enable_shared_from_this<kratos::Generator>::shared_from_this
            ((enable_shared_from_this<kratos::Generator> *)&mod1_a);
  kratos::Generator::add_child_generator
            ((Generator *)_Var4._M_nxt,&local_730,(shared_ptr<kratos::Generator> *)&mod1_a);
  std::shared_ptr<kratos::Generator>::~shared_ptr((shared_ptr<kratos::Generator> *)&mod1_a);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  _Var4._M_nxt = local_270._M_nxt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_770,"a",(allocator<char> *)((long)&mod1_b + 7));
  pPVar6 = kratos::Generator::port((Generator *)_Var4._M_nxt,In,&local_770,1);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator((allocator<char> *)((long)&mod1_b + 7));
  _Var4._M_nxt = local_270._M_nxt;
  local_750 = (undefined1  [8])pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a0,"b",&local_7a1);
  pPVar6 = kratos::Generator::port((Generator *)_Var4._M_nxt,Out,&local_7a0,1);
  std::__cxx11::string::~string((string *)&local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  _Var4._M_nxt = local_270._M_nxt;
  _Var3._M_nxt = local_2a0._M_nxt;
  local_780 = pPVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"p",&local_7f9);
  kratos::Generator::get_bundle_ref((Generator *)local_7d8,(string *)_Var3._M_nxt);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_7d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_820,"a",&local_821);
  pPVar6 = kratos::PortBundleRef::get_port(peVar7,&local_820);
  kratos::Var::assign((Var *)local_7c8,&pPVar6->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_7c8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_7c8);
  kratos::Generator::add_stmt
            ((Generator *)_Var4._M_nxt,(shared_ptr<kratos::Stmt> *)(local_7c8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_7c8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_7c8);
  std::__cxx11::string::~string((string *)&local_820);
  std::allocator<char>::~allocator(&local_821);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  _Var4._M_nxt = local_270._M_nxt;
  _Var3._M_nxt = local_2a0._M_nxt;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_878,"p",&local_879);
  kratos::Generator::get_bundle_ref((Generator *)local_858,(string *)_Var3._M_nxt);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_858);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8a0,"b",&local_8a1);
  pPVar6 = kratos::PortBundleRef::get_port(peVar7,&local_8a0);
  kratos::Var::assign((Var *)local_848,&pPVar6->super_Var);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_848 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_848);
  kratos::Generator::add_stmt
            ((Generator *)_Var4._M_nxt,(shared_ptr<kratos::Stmt> *)(local_848 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_848 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_848);
  std::__cxx11::string::~string((string *)&local_8a0);
  std::allocator<char>::~allocator(&local_8a1);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_858);
  std::__cxx11::string::~string(local_878);
  std::allocator<char>::~allocator(&local_879);
  _Var4._M_nxt = local_270._M_nxt;
  kratos::Var::assign((Var *)local_8c8,(Var *)local_5b8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_8c8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_8c8);
  kratos::Generator::add_stmt
            ((Generator *)_Var4._M_nxt,(shared_ptr<kratos::Stmt> *)(local_8c8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_8c8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_8c8);
  _Var4._M_nxt = local_270._M_nxt;
  kratos::Var::assign((Var *)local_8e8,(Var *)local_5e8);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_8e8 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_8e8);
  kratos::Generator::add_stmt
            ((Generator *)_Var4._M_nxt,(shared_ptr<kratos::Stmt> *)(local_8e8 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_8e8 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_8e8);
  _Var4._M_nxt = local_270._M_nxt;
  auVar2 = local_2d0;
  uVar1 = local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_938,"p",&local_939);
  kratos::Generator::get_bundle_ref((Generator *)local_918,(string *)auVar2);
  peVar7 = std::__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<kratos::PortBundleRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_918);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_960,"b",&local_961);
  pPVar6 = kratos::PortBundleRef::get_port(peVar7,&local_960);
  kratos::Var::operator+(&pPVar6->super_Var,(Var *)local_368);
  kratos::Var::assign((Var *)local_908,(Var *)uVar1);
  std::shared_ptr<kratos::Stmt>::shared_ptr<kratos::AssignStmt,void>
            ((shared_ptr<kratos::Stmt> *)(local_908 + 0x10),
             (shared_ptr<kratos::AssignStmt> *)local_908);
  kratos::Generator::add_stmt
            ((Generator *)_Var4._M_nxt,(shared_ptr<kratos::Stmt> *)(local_908 + 0x10));
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)(local_908 + 0x10));
  std::shared_ptr<kratos::AssignStmt>::~shared_ptr((shared_ptr<kratos::AssignStmt> *)local_908);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::shared_ptr<kratos::PortBundleRef>::~shared_ptr
            ((shared_ptr<kratos::PortBundleRef> *)local_918);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_939);
  kratos::fix_assignment_type((Generator *)local_270._M_nxt);
  kratos::verify_generator_connectivity((Generator *)local_270._M_nxt);
  kratos::change_port_bundle_struct((Generator *)local_270._M_nxt);
  kratos::verify_generator_connectivity((Generator *)local_270._M_nxt);
  kratos::decouple_generator_ports((Generator *)local_270._M_nxt);
  kratos::create_module_instantiation((Generator *)local_270._M_nxt);
  kratos::remove_fanout_one_wires((Generator *)local_270._M_nxt);
  kratos::generate_verilog_abi_cxx11_(&local_998,(kratos *)local_270._M_nxt,top);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&local_998);
  kratos::PortBundleDefinition::~PortBundleDefinition((PortBundleDefinition *)local_1e0);
  kratos::Context::~Context
            ((Context *)&def.debug_info_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

TEST(pass, bundle_to_struct) {  // NOLINT
    Context c;
    auto def = PortBundleDefinition("bundle");
    def.add_definition("a", 1, 1, false, PortDirection::In, PortType::Data);
    def.add_definition("b", 1, 1, false, PortDirection::In, PortType::Data);
    auto &mod1 = c.generator("module1");
    auto &mod2 = c.generator("module2");
    auto &mod3 = c.generator("module3");

    // mod2 definition
    mod2.add_bundle_port_def("p", def);
    auto &port2_a = mod2.port(PortDirection::Out, "a", 1);
    auto &port2_b = mod2.port(PortDirection::Out, "b", 1);
    mod2.add_stmt(port2_a.assign(mod2.get_bundle_ref("p")->get_port("a")));
    mod2.add_stmt(port2_b.assign(mod2.get_bundle_ref("p")->get_port("b")));
    mod1.add_child_generator("mod2", mod2.shared_from_this());

    // mod3 definition
    mod3.add_bundle_port_def("p", def.flip());
    auto &port3_a = mod3.port(PortDirection::In, "a", 1);
    auto &port3_b = mod3.port(PortDirection::In, "b", 1);
    mod3.add_stmt(mod3.get_bundle_ref("p")->get_port("a").assign(port3_a));
    mod3.add_stmt(mod3.get_bundle_ref("p")->get_port("b").assign(port3_b));
    mod1.add_child_generator("mod3", mod3.shared_from_this());

    // mod1 definition
    auto &mod1_a = mod1.port(PortDirection::In, "a", 1);
    auto &mod1_b = mod1.port(PortDirection::Out, "b", 1);
    mod1.add_stmt(mod2.get_bundle_ref("p")->get_port("a").assign(mod1_a));
    mod1.add_stmt(mod2.get_bundle_ref("p")->get_port("b").assign(mod1_a));
    mod1.add_stmt(port3_a.assign(mod1_a));
    mod1.add_stmt(port3_b.assign(mod1_a));
    mod1.add_stmt(mod1_b.assign(mod3.get_bundle_ref("p")->get_port("b") + port2_b));

    // run bundle to pack pass
    fix_assignment_type(&mod1);
    verify_generator_connectivity(&mod1);
    // remove_pass_through_modules(&mod1);
    change_port_bundle_struct(&mod1);
    verify_generator_connectivity(&mod1);
    decouple_generator_ports(&mod1);
    create_module_instantiation(&mod1);
    remove_fanout_one_wires(&mod1);
    generate_verilog(&mod1);
}